

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_MatrixLookAt(float *matrix,float eye_x,float eye_y,float eye_z,float target_x,
                     float target_y,float target_z,float up_x,float up_y,float up_z)

{
  float local_98;
  float local_94;
  float view [16];
  float side [3];
  float up [3];
  float forward [3];
  float up_y_local;
  float up_x_local;
  float target_z_local;
  float target_y_local;
  float target_x_local;
  float eye_z_local;
  float eye_y_local;
  float eye_x_local;
  float *matrix_local;
  
  up[1] = target_x - eye_x;
  up[2] = target_y - eye_y;
  up[0] = up_z;
  side[1] = up_x;
  side[2] = up_y;
  GPU_VectorNormalize(up + 1);
  GPU_VectorNormalize(side + 1);
  GPU_VectorCross(view + 0xf,up + 1,side + 1);
  GPU_VectorCross(side + 1,view + 0xf,up + 1);
  local_98 = view[0xf];
  view[6] = side[0];
  view[10] = 0.0;
  local_94 = side[1];
  view[3] = side[2];
  view[7] = up[0];
  view[0xb] = 0.0;
  view[0] = -up[1];
  view[4] = -up[2];
  view[8] = -(target_z - eye_z);
  view[0xc] = 0.0;
  view[9] = 0.0;
  view[5] = 0.0;
  view[1] = 0.0;
  view[0xd] = 1.0;
  GPU_MultiplyAndAssign(matrix,&local_98);
  GPU_MatrixTranslate(matrix,-eye_x,-eye_y,-eye_z);
  return;
}

Assistant:

void GPU_MatrixLookAt(float* matrix, float eye_x, float eye_y, float eye_z, float target_x, float target_y, float target_z, float up_x, float up_y, float up_z)
{
	float forward[3] = {target_x - eye_x, target_y - eye_y, target_z - eye_z};
	float up[3] = {up_x, up_y, up_z};
	float side[3];
	float view[16];

	GPU_VectorNormalize(forward);
	GPU_VectorNormalize(up);

	// Calculate sideways vector
	GPU_VectorCross(side, forward, up);

	// Calculate new up vector
	GPU_VectorCross(up, side, forward);

	// Set up view matrix
	view[0] = side[0];
	view[4] = side[1];
	view[8] = side[2];
	view[12] = 0.0f;

	view[1] = up[0];
	view[5] = up[1];
	view[9] = up[2];
	view[13] = 0.0f;

	view[2] = -forward[0];
	view[6] = -forward[1];
	view[10] = -forward[2];
	view[14] = 0.0f;

	view[3] = view[7] = view[11] = 0.0f;
	view[15] = 1.0f;

	GPU_MultiplyAndAssign(matrix, view);
	GPU_MatrixTranslate(matrix, -eye_x, -eye_y, -eye_z);
}